

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_12a95a::DefaultErrStreamBuf::overflow(DefaultErrStreamBuf *this,int character)

{
  int iVar1;
  
  if (character == -1) {
    iVar1 = (**(code **)(*(long *)this + 0x30))(this);
    return iVar1;
  }
  if (*(long *)&this->field_0x28 != *(long *)&this->field_0x30) {
    iVar1 = std::streambuf::sputc((char)this);
    return iVar1;
  }
  (**(code **)(*(long *)this + 0x30))(this);
  iVar1 = (**(code **)(*(long *)this + 0x68))(this,character);
  return iVar1;
}

Assistant:

virtual int overflow(int character)
    {
        if ((character != EOF) && (pptr() != epptr()))
        {
            // Valid character
            return sputc(static_cast<char>(character));
        }
        else if (character != EOF)
        {
            // Not enough space in the buffer: synchronize output and try again
            sync();
            return overflow(character);
        }
        else
        {
            // Invalid character: synchronize output
            return sync();
        }
    }